

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_x86.c
# Opt level: O0

void aes_init_dec_x86(aes_context *ctx,uint8_t *key)

{
  int iVar1;
  undefined8 uVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  undefined1 auVar5 [16];
  ulong local_1d0;
  size_t i;
  __m128i *dkey;
  __m128i *ekey;
  aes_context enc;
  uint8_t *key_local;
  aes_context *ctx_local;
  undefined8 local_68;
  undefined8 uStack_60;
  
  ekey._0_4_ = ctx->nr;
  enc.key._264_8_ = key;
  aes_init_x86((aes_context *)&ekey,key);
  puVar3 = ctx->key;
  puVar4 = puVar3 + (long)ctx->nr * 4;
  puVar4[0] = enc._8_4_;
  puVar4[1] = enc._12_4_;
  *(undefined8 *)(puVar4 + 2) = enc.key._0_8_;
  for (local_1d0 = 1; local_1d0 < (ulong)(long)ctx->nr; local_1d0 = local_1d0 + 1) {
    iVar1 = ctx->nr;
    auVar5._8_8_ = *(undefined8 *)(enc.key + local_1d0 * 4);
    auVar5._0_8_ = *(undefined8 *)(enc.key + local_1d0 * 4 + -2);
    auVar5 = aesimc(auVar5);
    local_68 = auVar5._0_8_;
    uStack_60 = auVar5._8_8_;
    *(undefined8 *)(puVar3 + (long)iVar1 * 4 + local_1d0 * -4) = local_68;
    *(undefined8 *)(puVar3 + (long)iVar1 * 4 + local_1d0 * -4 + 2) = uStack_60;
  }
  uVar2 = *(undefined8 *)(enc.key + (long)ctx->nr * 4);
  *(undefined8 *)puVar3 = *(undefined8 *)(enc.key + (long)ctx->nr * 4 + -2);
  *(undefined8 *)(ctx->key + 2) = uVar2;
  return;
}

Assistant:

void aes_init_dec_x86(aes_context* ctx, const uint8_t* key)
{
  aes_context enc;
  enc.nr = ctx->nr;
  aes_init_x86(&enc, key);

  const __m128i* ekey = (__m128i*)&enc.key;
  __m128i* dkey = (__m128i*)&ctx->key;

  _mm_store_si128(dkey + ctx->nr, _mm_load_si128(ekey + 0));
  for (size_t i = 1; i < ctx->nr; i++)
  {
    _mm_store_si128(dkey + ctx->nr - i, _mm_aesimc_si128(_mm_load_si128(ekey + i)));
  }
  _mm_store_si128(dkey + 0, _mm_load_si128(ekey + ctx->nr));
}